

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.cc
# Opt level: O0

size_t ver_get_new_filename_off(filemgr_magic_t magic)

{
  filemgr_magic_t magic_local;
  undefined8 local_8;
  
  if (magic == 0xdeadcafebeefbeef) {
    local_8 = 0x40;
  }
  else if (magic == 0xdeadcafebeefc001) {
    local_8 = 0x48;
  }
  else if (magic == 0xdeadcafebeefc002) {
    local_8 = 0x50;
  }
  else {
    local_8 = 0xffffffffffffffff;
  }
  return local_8;
}

Assistant:

size_t ver_get_new_filename_off(filemgr_magic_t magic) {
    switch(magic) {
        case FILEMGR_MAGIC_000: return 64;
        case FILEMGR_MAGIC_001: return 72;
        case FILEMGR_MAGIC_002: return 80;
    }
    return (size_t) -1;
}